

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_engine.cpp
# Opt level: O1

int zmq::udp_engine_t::set_udp_multicast_ttl(fd_t s_,bool is_ipv6_,int hops_)

{
  int iVar1;
  undefined7 in_register_00000031;
  undefined1 local_14 [4];
  
  iVar1 = (int)CONCAT71(in_register_00000031,is_ipv6_);
  if (iVar1 != 0) {
    iVar1 = 0x29;
  }
  iVar1 = setsockopt(s_,iVar1,0x21,local_14,4);
  assert_success_or_recoverable(s_,iVar1);
  return iVar1;
}

Assistant:

int zmq::udp_engine_t::set_udp_multicast_ttl (fd_t s_, bool is_ipv6_, int hops_)
{
    int level;

    if (is_ipv6_) {
        level = IPPROTO_IPV6;
    } else {
        level = IPPROTO_IP;
    }

    const int rc =
      setsockopt (s_, level, IP_MULTICAST_TTL,
                  reinterpret_cast<char *> (&hops_), sizeof (hops_));
    assert_success_or_recoverable (s_, rc);
    return rc;
}